

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall transwarp::detail::thread_pool::thread_pool(thread_pool *this,size_t n_threads)

{
  invalid_parameter *this_00;
  size_type sVar1;
  id iVar2;
  thread_pool *local_80;
  code *local_78;
  undefined8 local_70;
  thread local_68;
  thread local_60;
  thread thread;
  size_t n_target;
  string local_48;
  size_t local_18;
  size_t n_threads_local;
  thread_pool *this_local;
  
  this->done_ = false;
  local_18 = n_threads;
  n_threads_local = (size_t)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->functors_);
  std::condition_variable::condition_variable(&this->cond_var_);
  std::mutex::mutex(&this->mutex_);
  if (local_18 == 0) {
    n_target._6_1_ = 1;
    this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"number of threads",(allocator *)((long)&n_target + 7));
    invalid_parameter::invalid_parameter(this_00,&local_48);
    n_target._6_1_ = 0;
    __cxa_throw(this_00,&invalid_parameter::typeinfo,invalid_parameter::~invalid_parameter);
  }
  sVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
  thread._M_id._M_thread = (id)(sVar1 + local_18);
  while( true ) {
    iVar2._M_thread = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
    if ((ulong)thread._M_id._M_thread <= iVar2._M_thread) break;
    std::thread::thread(&local_60);
    local_78 = worker;
    local_70 = 0;
    local_80 = this;
    std::thread::
    thread<void(transwarp::detail::thread_pool::*)(),transwarp::detail::thread_pool*,void>
              (&local_68,(type *)&local_78,&local_80);
    std::thread::operator=(&local_60,&local_68);
    std::thread::~thread(&local_68);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back(&this->threads_,&local_60);
    std::thread::~thread(&local_60);
  }
  return;
}

Assistant:

explicit thread_pool(std::size_t n_threads)
    : done_(false)
    {
        if (n_threads == 0) {
            throw transwarp::invalid_parameter("number of threads");
        }
        const std::size_t n_target = threads_.size() + n_threads;
        while (threads_.size() < n_target) {
            std::thread thread;
            try {
                thread = std::thread(&thread_pool::worker, this);
            } catch (...) {
                shutdown();
                throw;
            }
            try {
                threads_.push_back(std::move(thread));
            } catch (...) {
                shutdown();
                thread.join();
                throw;
            }
        }
    }